

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualStack.cpp
# Opt level: O2

void __thiscall VirtualStack::VirtualStack(VirtualStack *this)

{
  long lVar1;
  allocator local_39;
  string local_38;
  
  this->_vptr_VirtualStack = (_func_int **)&PTR__VirtualStack_00113d88;
  lVar1 = 0;
  do {
    Variable::Variable((Variable *)((long)&this->stack[0].type + lVar1));
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0x15f900);
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  Variable::Variable(&this->errorDefault,&local_38,INT);
  std::__cxx11::string::~string((string *)&local_38);
  Parser::Parser(&this->parser);
  this->stackOffset = 0;
  return;
}

Assistant:

VirtualStack::VirtualStack()
: errorDefault("", DataType::INT)
{
    //ctor
    stackOffset = 0;
}